

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_godunov_ppm.cpp
# Opt level: O0

void PPM::PredictVelOnFaces
               (Box *bx,Array4<double> *Imx,Array4<double> *Imy,Array4<double> *Imz,
               Array4<double> *Ipx,Array4<double> *Ipy,Array4<double> *Ipz,Array4<const_double> *q,
               Array4<const_double> *vel,Geometry geom,Real dt,BCRec *pbc)

{
  void *in_RCX;
  void *in_RDX;
  void *in_RSI;
  void *in_R8;
  void *in_R9;
  double in_XMM0_Qa;
  void *in_stack_00000008;
  void *in_stack_00000010;
  void *in_stack_00000018;
  undefined8 in_stack_000000e8;
  Real l_dtdz;
  Real l_dtdy;
  Real l_dtdx;
  GpuArray<double,_3U> dx;
  Dim3 dhi;
  Dim3 dlo;
  Box *domain;
  undefined1 auStackY_3b8 [48];
  anon_class_568_14_bf0fd74e *in_stack_fffffffffffffc78;
  int in_stack_fffffffffffffc84;
  Box *in_stack_fffffffffffffc88;
  undefined1 auStack_338 [64];
  undefined1 auStack_2f8 [64];
  undefined8 local_2b8;
  undefined8 local_2b0;
  int local_2a8;
  undefined8 local_2a4;
  int local_29c;
  double local_298;
  undefined1 auStack_290 [64];
  undefined1 auStack_250 [64];
  double local_210;
  undefined1 auStack_208 [64];
  undefined1 auStack_1c8 [64];
  double local_188;
  double local_180;
  double local_178;
  GpuArray<double,_3U> local_170;
  undefined8 local_158;
  int local_150;
  undefined8 local_144;
  int local_13c;
  undefined8 local_138;
  int local_130;
  undefined8 local_128;
  int local_120;
  Box *local_118;
  double local_110;
  void *local_108;
  void *local_100;
  void *local_f8;
  void *local_f0;
  void *local_e8;
  undefined8 local_d8;
  int local_d0;
  Box *local_c8;
  int local_bc;
  int iStack_b8;
  int local_b4;
  undefined8 local_b0;
  int local_a8;
  Box *local_a0;
  int local_98;
  int iStack_94;
  int local_90;
  undefined4 local_8c;
  GpuArray<double,_3U> *local_88;
  undefined4 local_7c;
  GpuArray<double,_3U> *local_78;
  undefined4 local_6c;
  GpuArray<double,_3U> *local_68;
  undefined4 local_5c;
  IntVect *local_58;
  undefined4 local_4c;
  IntVect *local_48;
  undefined4 local_3c;
  IntVect *local_38;
  undefined4 local_2c;
  Box *local_28;
  undefined4 local_1c;
  Box *local_18;
  undefined4 local_c;
  Box *local_8;
  
  local_110 = in_XMM0_Qa;
  local_108 = in_R9;
  local_100 = in_R8;
  local_f8 = in_RCX;
  local_f0 = in_RDX;
  local_e8 = in_RSI;
  local_118 = amrex::Geometry::Domain((Geometry *)&stack0x00000020);
  local_c = 0;
  local_bc = (local_118->smallend).vect[0];
  local_1c = 1;
  iStack_b8 = (local_118->smallend).vect[1];
  local_138 = *(undefined8 *)(local_118->smallend).vect;
  local_2c = 2;
  local_130 = (local_118->smallend).vect[2];
  local_38 = &local_118->bigend;
  local_3c = 0;
  local_98 = local_38->vect[0];
  local_48 = &local_118->bigend;
  local_4c = 1;
  iStack_94 = (local_118->bigend).vect[1];
  local_158 = *(undefined8 *)local_38->vect;
  local_58 = &local_118->bigend;
  local_5c = 2;
  local_150 = (local_118->bigend).vect[2];
  local_144 = local_158;
  local_13c = local_150;
  local_128 = local_138;
  local_120 = local_130;
  local_d8 = local_138;
  local_d0 = local_130;
  local_c8 = local_118;
  local_b4 = local_130;
  local_b0 = local_158;
  local_a8 = local_150;
  local_a0 = local_118;
  local_90 = local_150;
  local_28 = local_118;
  local_18 = local_118;
  local_8 = local_118;
  amrex::CoordSys::CellSizeArray(&local_170,(CoordSys *)&stack0x00000020);
  local_68 = &local_170;
  local_6c = 0;
  local_178 = local_110 / local_170.arr[0];
  local_78 = &local_170;
  local_7c = 1;
  local_180 = local_110 / local_170.arr[1];
  local_88 = &local_170;
  local_8c = 2;
  local_188 = local_110 / local_170.arr[2];
  memcpy(auStackY_3b8,in_stack_00000018,0x3c);
  memcpy(&stack0xfffffffffffffc88,in_stack_00000010,0x3c);
  memcpy(auStack_338,local_e8,0x3c);
  memcpy(auStack_2f8,local_100,0x3c);
  local_2b8 = in_stack_000000e8;
  local_2b0 = local_128;
  local_2a8 = local_120;
  local_2a4 = local_144;
  local_29c = local_13c;
  local_298 = local_180;
  memcpy(auStack_290,local_f0,0x3c);
  memcpy(auStack_250,local_108,0x3c);
  local_210 = local_188;
  memcpy(auStack_208,local_f8,0x3c);
  memcpy(auStack_1c8,in_stack_00000008,0x3c);
  amrex::
  ParallelFor<int,PPM::PredictVelOnFaces(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Geometry,double,amrex::BCRec_const*)::__0,void>
            (in_stack_fffffffffffffc88,in_stack_fffffffffffffc84,in_stack_fffffffffffffc78);
  return;
}

Assistant:

void
PPM::PredictVelOnFaces (Box const& bx,
                        AMREX_D_DECL( Array4<Real> const& Imx,
                                      Array4<Real> const& Imy,
                                      Array4<Real> const& Imz),
                        AMREX_D_DECL( Array4<Real> const& Ipx,
                                      Array4<Real> const& Ipy,
                                      Array4<Real> const& Ipz),
                        Array4<Real const> const& q,
                        Array4<Real const> const& vel,
                        Geometry geom,
                        Real dt,
                        BCRec const* pbc)
{
    const Box& domain = geom.Domain();
    const Dim3 dlo = amrex::lbound(domain);
    const Dim3 dhi = amrex::ubound(domain);

    const auto dx = geom.CellSizeArray();
    AMREX_D_TERM( Real l_dtdx = dt / dx[0];,
                  Real l_dtdy = dt / dx[1];,
                  Real l_dtdz = dt / dx[2];);

    amrex::ParallelFor(bx, AMREX_SPACEDIM,
    [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {
        PredictVelOnXFace(i,j,k,n,l_dtdx,vel(i,j,k,0),q,Imx,Ipx,pbc[n],dlo.x,dhi.x);
        PredictVelOnYFace(i,j,k,n,l_dtdy,vel(i,j,k,1),q,Imy,Ipy,pbc[n],dlo.y,dhi.y);
#if (AMREX_SPACEDIM==3)
        PredictVelOnZFace(i,j,k,n,l_dtdz,vel(i,j,k,2),q,Imz,Ipz,pbc[n],dlo.z,dhi.z);
#endif
    });
}